

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O3

void __thiscall
ktx::OutputStream::writeKTX2(OutputStream *this,ktxTexture *texture,Reporter *report)

{
  pointer pcVar1;
  ktx_error_code_e kVar2;
  long *local_a0;
  undefined8 local_98;
  undefined1 local_90;
  undefined7 uStack_8f;
  undefined8 uStack_88;
  long *local_80;
  undefined8 local_78;
  long local_70;
  undefined8 uStack_68;
  long *local_60;
  path local_58;
  
  kVar2 = (*texture->vtbl->WriteToStdioStream)(texture,this->file);
  if (kVar2 != KTX_SUCCESS) {
    if (this->file != _stdout) {
      pcVar1 = (this->filepath)._M_dataplus._M_p;
      local_a0 = (long *)&local_90;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a0,pcVar1,pcVar1 + (this->filepath)._M_string_length);
      if (local_a0 == (long *)&local_90) {
        uStack_68 = uStack_88;
        local_a0 = &local_70;
      }
      local_70 = CONCAT71(uStack_8f,local_90);
      local_78 = local_98;
      local_98 = 0;
      local_90 = 0;
      local_80 = local_a0;
      local_a0 = (long *)&local_90;
      local_60 = local_80;
      std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
                (&local_58,(char **)&local_60,auto_format);
      std::filesystem::remove(&local_58);
      std::filesystem::__cxx11::path::~path(&local_58);
      if (local_80 != &local_70) {
        operator_delete(local_80,local_70 + 1);
      }
      if (local_a0 != (long *)&local_90) {
        operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
      }
    }
    local_58._M_pathname._M_dataplus._M_p = (pointer)ktxErrorString(kVar2);
    Reporter::fatal<char_const(&)[46],std::__cxx11::string&,char_const*>
              (report,IO_FAILURE,(char (*) [46])"Failed to write KTX file \"{}\": KTX error: {}.",
               &this->filepath,(char **)&local_58);
  }
  return;
}

Assistant:

void OutputStream::writeKTX2(ktxTexture* texture, Reporter& report) {
    const auto ret = ktxTexture_WriteToStdioStream(texture, file);
    if (KTX_SUCCESS != ret) {
        if (file != stdout)
            std::filesystem::remove(DecodeUTF8Path(filepath).c_str());
        report.fatal(rc::IO_FAILURE, "Failed to write KTX file \"{}\": KTX error: {}.", filepath, ktxErrorString(ret));
    }

    // TODO: Investigate and resolve the portability issue with the C++ streams. The issue will most likely
    //       be in StreambufStream's position reporting and seeking. Currently a fallback is implemented in C above.
    // StreambufStream<std::streambuf*> stream(activeStream->rdbuf(), std::ios::in | std::ios::binary);
    // const auto ret = ktxTexture_WriteToStream(texture, stream.stream());
    //
    // if (KTX_SUCCESS != ret) {
    //     if (activeStream != &std::cout)
    //         std::filesystem::remove(DecodeUTF8Path(filepath).c_str());
    //     report.fatal(rc::IO_FAILURE, "Failed to write KTX file \"{}\": {}.", fmtOutFile(filepath), ktxErrorString(ret));
    // }
}